

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O3

void get_max_cover_static2<256ul,1>
               (vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *sets,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *names,vector<unsigned_long,_std::allocator<unsigned_long>_> *_begin,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *_end,bool print_progress)

{
  pointer paVar1;
  ostream *poVar2;
  array<unsigned_long,_1UL> *collection;
  pointer paVar3;
  size_t progress;
  size_t this_count;
  collection end;
  collection indices;
  size_t N;
  size_type n;
  vector<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_> binary_sets;
  pair<unsigned_long,_std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>_>
  local_d8;
  size_type local_b8;
  unsigned_long local_b0;
  size_t local_a8;
  collection local_a0;
  collection local_98;
  unsigned_long local_90;
  unsigned_long local_88;
  vector<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_> local_80;
  anon_class_56_7_64ceefa5 local_68;
  
  BitSetsFromSets<256ul>(&local_80,sets,names);
  local_68.n = &local_88;
  local_68.indices = &local_98;
  local_68.end = &local_a0;
  local_68.this_count = &local_a8;
  local_68.progress = &local_b0;
  local_90 = ((long)(sets->
                    super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(sets->
                    super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_98._M_elems[0] =
       (_Type)*(_begin->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
  local_a0._M_elems[0] =
       (_Type)*(_end->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
  local_a8 = 0;
  local_b0 = 0;
  local_68.best = &local_d8;
  local_d8.first = 0;
  local_d8.second.
  super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.second.
  super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.second.
  super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8 = (names->_M_h)._M_element_count;
  local_88 = local_90;
  local_68.binary_sets = &local_80;
  ProgressIndicator<std::exception,get_max_cover_static2<256ul,1>(std::vector<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::allocator<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>const&,std::unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool)::_lambda()_1_,unsigned_long&,unsigned_long,unsigned_long&,unsigned_long_const&>
            ("\r%zu/%zu @ %zu/%zu",print_progress,&local_68,&(local_68.best)->first,&local_b8,
             local_68.progress,&local_90);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_68.indices = (collection *)CONCAT71(local_68.indices._1_7_,0x2f);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_68,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  paVar1 = local_d8.second.
           super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_d8.second.
      super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_d8.second.
      super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar3 = local_d8.second.
             super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_68.indices = (collection *)CONCAT71(local_68.indices._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_68,1);
      paVar3 = paVar3 + 1;
    } while (paVar3 != paVar1);
  }
  if (local_d8.second.
      super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.second.
                    super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void get_max_cover_static2(const std::vector<Set>& sets, const std::unordered_map<std::string, size_t>& names,
    const std::vector<size_t>& _begin, const std::vector<size_t>& _end, bool print_progress = false)
{
    const std::vector<std::bitset<n_entities>> binary_sets = BitSetsFromSets<n_entities>(sets, names);
    const auto n = sets.size();
    const auto N = nchoosek(n, k);
    
    typedef std::array<size_t, k> collection;
    
    collection indices, end;

    for (size_t i = 0; i < k; ++i)
    {
        indices[i] = _begin[i];
        end[i] = _end[i];
    }

    std::pair<size_t, std::vector<collection>> best;
    best.first = 0; best.second.clear();
    size_t this_count = 0;
    size_t progress = 0;
    ProgressIndicator("\r%zu/%zu @ %zu/%zu", print_progress, [&]()
    {
        int i;
        int b = 0; // first index where 'indices' and 'end' differ
        for (; b < k; ++b)
            if (indices[b] != end[b])
                break;

        // https://docs.python.org/2/library/itertools.html#itertools.combinations
        while (running && b < k)
        {
            //for (auto x : indices)
            //    std::cerr << x << '\t';
            //std::cerr << std::endl;

            this_count = sets_union(binary_sets, indices);
            if (this_count > best.first)
            {
                best.second.clear();
                best.second.push_back(indices);
                best.first = this_count;
            }
            else if (this_count == best.first)
            {
                best.second.push_back(indices);
            }
            ++progress;

            for (i = k - 1; i >= b; --i)
                if (indices[i] != (i + n) - k)
                    break;

            if (i < b)
                break;

            indices[i] += 1;
            for (size_t j = i + 1; j < k; ++j)
                indices[j] = indices[j - 1] + 1;
            if (i == b) // recalculates place of first differ
                for (; b < k; ++b)
                    if (indices[b] != end[b])
                        break;
        }
    }, best.first, names.size(), progress, N);
    
    std::cout << best.first << '/' << names.size() << std::endl;
    for (const auto& collection : best.second)
    {
        std::cout << collection[0];
        for (size_t j = 1; j < k; ++j)
        {
            std::cout << '\t' << collection[j];
        }
        std::cout << '\n';
    }
}